

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

bool __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::matches
          (call_matcher<void_(),_std::tuple<>_> *this,call_params_type_t<void_()> *params)

{
  char cVar1;
  condition_base<void_()> *c;
  list_elem<trompeloeil::condition_base<void_()>_> *plVar3;
  int iVar2;
  
  plVar3 = (this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>.next;
  if (plVar3 == &(this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>) {
    cVar1 = '\x01';
  }
  else {
    do {
      iVar2 = (*plVar3->_vptr_list_elem[2])(plVar3,params);
      cVar1 = (char)iVar2;
      if (cVar1 == '\0') {
        return false;
      }
      plVar3 = plVar3->next;
    } while (plVar3 != &(this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>);
  }
  return (bool)cVar1;
}

Assistant:

bool
    matches(
      call_params_type_t<Sig> const& params)
    const
    override
    {
      return match_parameters(val, params) && match_conditions(params);
    }